

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_unlink_leafref_node(lyd_node_term *node,lyd_node_term *leafref_node)

{
  lysc_node *plVar1;
  lyd_node_term **pplVar2;
  uint16_t uVar3;
  LY_ERR LVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  uint64_t index__;
  lyd_node_term *plVar7;
  lyd_node_term *plVar8;
  int8_t *piVar9;
  LY_ERR LVar10;
  lyd_leafref_links_rec *rec;
  lyd_node_term *in_stack_ffffffffffffffd8;
  lyd_leafref_links_rec *local_20;
  
  if (node == (lyd_node_term *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0xea6,
                  "LY_ERR lyd_unlink_leafref_node(const struct lyd_node_term *, const struct lyd_node_term *)"
                 );
  }
  if (leafref_node == (lyd_node_term *)0x0) {
    __assert_fail("leafref_node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0xea7,
                  "LY_ERR lyd_unlink_leafref_node(const struct lyd_node_term *, const struct lyd_node_term *)"
                 );
  }
  plVar1 = (node->field_0).node.schema;
  if (plVar1 == (lysc_node *)0x0) {
    plVar6 = (lys_module *)&node[1].field_0.node.next;
  }
  else {
    plVar6 = plVar1->module;
  }
  uVar3 = ly_ctx_get_options(plVar6->ctx);
  LVar4 = LY_EDENIED;
  if ((uVar3 >> 10 & 1) != 0) {
    LVar4 = lyd_get_or_create_leafref_links_record(node,&local_20,'\0');
    if (LVar4 != LY_ENOTFOUND) {
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      pplVar2 = local_20->leafref_nodes;
      plVar7 = (lyd_node_term *)0x0;
      while( true ) {
        if (pplVar2 == (lyd_node_term **)0x0) {
          plVar8 = (lyd_node_term *)0x0;
        }
        else {
          plVar8 = pplVar2[-1];
        }
        if (plVar8 <= plVar7) goto LAB_001258ca;
        if (pplVar2[(long)plVar7] == leafref_node) break;
        plVar7 = (lyd_node_term *)((long)&plVar7->field_0 + 1);
      }
      if (pplVar2 == (lyd_node_term **)0x0) {
        plVar8 = (lyd_node_term *)0xffffffffffffffff;
      }
      else {
        plVar8 = (lyd_node_term *)((long)&pplVar2[-1][-1].value.field_2 + 0x17);
      }
      if (plVar8 != plVar7) {
        if (pplVar2 == (lyd_node_term **)0x0) {
          piVar9 = (int8_t *)0xffffffffffffffff;
        }
        else {
          piVar9 = &pplVar2[-1][-1].value.field_2.boolean + 0x17;
        }
        pplVar2[(long)plVar7] = pplVar2[(long)piVar9];
      }
      local_20->leafref_nodes[-1] =
           (lyd_node_term *)((long)&local_20->leafref_nodes[-1][-1].value.field_2 + 0x17);
LAB_001258ca:
      if (((local_20->leafref_nodes == (lyd_node_term **)0x0) ||
          (local_20->leafref_nodes[-1] == (lyd_node_term *)0x0)) &&
         ((local_20->target_nodes == (lyd_node_term **)0x0 ||
          (local_20->target_nodes[-1] == (lyd_node_term *)0x0)))) {
        lyd_free_leafref_nodes(in_stack_ffffffffffffffd8);
      }
    }
    LVar10 = LY_SUCCESS;
    LVar5 = lyd_get_or_create_leafref_links_record(leafref_node,&local_20,'\0');
    LVar4 = LY_SUCCESS;
    if ((LVar5 != LY_ENOTFOUND) && (LVar4 = LVar5, LVar5 == LY_SUCCESS)) {
      pplVar2 = local_20->target_nodes;
      plVar7 = (lyd_node_term *)0x0;
      while( true ) {
        if (pplVar2 == (lyd_node_term **)0x0) {
          plVar8 = (lyd_node_term *)0x0;
        }
        else {
          plVar8 = pplVar2[-1];
        }
        if (plVar8 <= plVar7) goto LAB_00125985;
        if (pplVar2[(long)plVar7] == node) break;
        plVar7 = (lyd_node_term *)((long)&plVar7->field_0 + 1);
      }
      if (pplVar2 == (lyd_node_term **)0x0) {
        plVar8 = (lyd_node_term *)0xffffffffffffffff;
      }
      else {
        plVar8 = (lyd_node_term *)((long)&pplVar2[-1][-1].value.field_2 + 0x17);
      }
      if (plVar8 != plVar7) {
        if (pplVar2 == (lyd_node_term **)0x0) {
          piVar9 = (int8_t *)0xffffffffffffffff;
        }
        else {
          piVar9 = &pplVar2[-1][-1].value.field_2.boolean + 0x17;
        }
        pplVar2[(long)plVar7] = pplVar2[(long)piVar9];
      }
      local_20->target_nodes[-1] =
           (lyd_node_term *)((long)&local_20->target_nodes[-1][-1].value.field_2 + 0x17);
LAB_00125985:
      LVar4 = LVar10;
      if (((local_20->leafref_nodes == (lyd_node_term **)0x0) ||
          (local_20->leafref_nodes[-1] == (lyd_node_term *)0x0)) &&
         ((local_20->target_nodes == (lyd_node_term **)0x0 ||
          (local_20->target_nodes[-1] == (lyd_node_term *)0x0)))) {
        lyd_free_leafref_nodes(in_stack_ffffffffffffffd8);
      }
    }
  }
  return LVar4;
}

Assistant:

LY_ERR
lyd_unlink_leafref_node(const struct lyd_node_term *node, const struct lyd_node_term *leafref_node)
{
    LY_ERR ret;
    struct lyd_leafref_links_rec *rec;

    assert(node);
    assert(leafref_node);

    if (!(ly_ctx_get_options(LYD_CTX(node)) & LY_CTX_LEAFREF_LINKING)) {
        return LY_EDENIED;
    }

    /* remove link from target node to leafref node */
    ret = lyd_get_or_create_leafref_links_record(node, &rec, 0);
    if (ret == LY_SUCCESS) {
        LY_ARRAY_REMOVE_VALUE(rec->leafref_nodes, leafref_node);
        if ((LY_ARRAY_COUNT(rec->leafref_nodes) == 0) && (LY_ARRAY_COUNT(rec->target_nodes) == 0)) {
            lyd_free_leafref_nodes(node);
        }
    } else if (ret != LY_ENOTFOUND) {
        return ret;
    }

    /* remove link from leafref node to target node */
    ret = lyd_get_or_create_leafref_links_record(leafref_node, &rec, 0);
    if (ret == LY_SUCCESS) {
        LY_ARRAY_REMOVE_VALUE(rec->target_nodes, node);
        if ((LY_ARRAY_COUNT(rec->leafref_nodes) == 0) && (LY_ARRAY_COUNT(rec->target_nodes) == 0)) {
            lyd_free_leafref_nodes(leafref_node);
        }
    } else if (ret != LY_ENOTFOUND) {
        return ret;
    }

    return LY_SUCCESS;
}